

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O1

_Bool borg_money_scum(void)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  char *what;
  long lVar5;
  keycode_t k;
  keycode_t k_00;
  
  iVar2 = borg_cfg[0x18];
  if (iVar2 != 0) {
    what = format("# Waiting for towns people to breed.  I need %d...",
                  (ulong)(uint)(iVar2 - borg.trait[0x2d]));
    borg_note(what);
    borg.in_shop = false;
    iVar3 = borg.trait[0x23];
    if (iVar3 < 0x23) {
      borg_keypress(0xe000);
      borg_keypress(0x52);
      k_00 = (uint)(0xe < iVar3) * 5 + 0x32;
      k = 0x35;
    }
    else {
      borg_keypress(0xe000);
      borg_keypress(0x52);
      borg_keypress(0x35);
      k_00 = 0x30;
      k = 0x30;
    }
    borg_keypress(k_00);
    borg_keypress(k);
    borg_keypress(0x9c);
    uVar1 = z_info->day_length;
    lVar5 = (long)turn % (long)((ulong)((uint)uVar1 + (uint)uVar1) * 5);
    if ((int)borg_t %
        (int)((uint)(SBORROW8(lVar5,(ulong)uVar1 * 5) != (long)(lVar5 + (ulong)uVar1 * -5) < 0) * 3
             + 2) != 0) {
      borg_keypress(0xe000);
      uVar4 = 0xffffffff;
      while ((uVar4 + 1 < 7 && ((0x43U >> (uVar4 + 1 & 0x1f) & 1) != 0))) {
        uVar4 = Rand_div(10);
        borg.goal.g.x = (int)((long)ddx[(int)uVar4] + (long)borg.c.x);
        borg.goal.g.y = (int)((long)ddy[(int)uVar4] + (long)borg.c.y);
        if (borg_grids[(long)ddy[(int)uVar4] + (long)borg.c.y]
            [(long)ddx[(int)uVar4] + (long)borg.c.x].feat != '\x01') {
          uVar4 = 0xffffffff;
        }
      }
      borg_keypress(uVar4 + 0x30);
    }
    borg_t = 10;
    borg.time_this_panel = 1;
    borg_began = 1;
  }
  return iVar2 != 0;
}

Assistant:

bool borg_money_scum(void)
{

    int dir     = -1;
    int divisor = 2;

    borg_grid *ag;

    /* Just a quick check to make sure we are supposed to do this */
    if (borg_cfg[BORG_MONEY_SCUM_AMOUNT] == 0)
        return false;

    /* Take note */
    borg_note(format("# Waiting for towns people to breed.  I need %d...",
        borg_cfg[BORG_MONEY_SCUM_AMOUNT] - borg.trait[BI_GOLD]));

    /* I'm not in a store */
    borg.in_shop = false;

    /* Rest for 9 months */
    if (borg.trait[BI_CLEVEL] >= 35) {
        borg_keypress(ESCAPE);
        borg_keypress('R');
        borg_keypress('5');
        borg_keypress('0');
        borg_keypress('0');
        borg_keypress(KC_ENTER);
    } else if (borg.trait[BI_CLEVEL] >= 15) {
        borg_keypress(ESCAPE);
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);
    } else /* Low level, dont want to get mobbed */
    {
        borg_keypress(ESCAPE);
        borg_keypress('R');
        borg_keypress('2');
        borg_keypress('5');
        borg_keypress(KC_ENTER);
    }

    /* Don't rest too long at night.  We tend to crash the game if too many
     * townsfolk are on the level
     */
    /* Night or day up in town */
    if ((turn % (10L * z_info->day_length)) < ((10L * z_info->day_length) / 2))
        divisor = 5;

    /* sometimes twitch in order to move around some */
    if (borg_t % divisor) {
        borg_keypress(ESCAPE);

        /* Pick a random direction */
        while (dir == -1 || dir == 5 || dir == 0) {
            dir = randint0(10);

            /* Hack -- set goal */
            borg.goal.g.x = borg.c.x + ddx[dir];
            borg.goal.g.y = borg.c.y + ddy[dir];

            ag            = &borg_grids[borg.goal.g.y][borg.goal.g.x];

            /* Skip walls and shops */
            if (ag->feat != FEAT_FLOOR)
                dir = -1;
        }

        /* Normally move */
        /* Send direction */
        borg_keypress(I2D(dir));
    }

    /* reset the clocks */
    borg_t               = 10;
    borg.time_this_panel = 1;
    borg_began           = 1;

    /* Done */
    return true;
}